

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

void spirv_cross::inner::
     join_helper<char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
               (StringStream<4096UL,_4096UL> *stream,char (*t) [2],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
               char (*ts_1) [3],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2,
               char (*ts_3) [3],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4,
               char (*ts_5) [2])

{
  size_t len;
  
  len = strlen(*t);
  StringStream<4096UL,_4096UL>::append(stream,*t,len);
  StringStream<4096UL,_4096UL>::append(stream,(ts->_M_dataplus)._M_p,ts->_M_string_length);
  join_helper<char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
            (stream,ts_1,ts_2,ts_3,ts_4,ts_5);
  return;
}

Assistant:

void join_helper(StringStream<> &stream, T &&t, Ts &&... ts)
{
	stream << std::forward<T>(t);
	join_helper(stream, std::forward<Ts>(ts)...);
}